

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerWithAttr::PathTypeHandlerWithAttr
          (PathTypeHandlerWithAttr *this,TypePath *typePath,ObjectSlotAttributes *attributes,
          PathTypeSetterSlotIndex *setters,PathTypeSetterSlotIndex setterCount,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  PathTypeHandlerBase::PathTypeHandlerBase
            ((PathTypeHandlerBase *)this,typePath,pathLength,slotCapacity,inlineSlotCapacity,
             offsetOfInlineSlots,isLocked,isShared,predecessorType);
  (this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01552820;
  Memory::Recycler::WBSetBit((char *)&this->attributes);
  (this->attributes).ptr = attributes;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->attributes);
  Memory::Recycler::WBSetBit((char *)&this->setters);
  (this->setters).ptr = setters;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->setters);
  this->setterCount = setterCount;
  return;
}

Assistant:

PathTypeHandlerWithAttr::PathTypeHandlerWithAttr(TypePath *typePath, ObjectSlotAttributes * attributes, PathTypeSetterSlotIndex * setters, PathTypeSetterSlotIndex setterCount, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType) :
        PathTypeHandlerNoAttr(typePath, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType),
        attributes(attributes),
        setters(setters),
        setterCount(setterCount)
    {
    }